

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# option-parser.cc
# Opt level: O0

void __thiscall
wabt::OptionParser::AddOption
          (OptionParser *this,char short_name,char *long_name,char *metavar,char *help,
          Callback *callback)

{
  allocator local_139;
  string local_138;
  allocator local_111;
  string local_110;
  allocator local_e9;
  string local_e8;
  undefined1 local_c8 [8];
  Option option;
  Callback *callback_local;
  char *help_local;
  char *metavar_local;
  char *long_name_local;
  char short_name_local;
  OptionParser *this_local;
  
  option.callback._M_invoker = (_Invoker_type)callback;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_e8,long_name,&local_e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_110,metavar,&local_111);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_138,help,&local_139);
  Option::Option((Option *)local_c8,short_name,&local_e8,&local_110,Yes,&local_138,
                 (Callback *)option.callback._M_invoker);
  std::__cxx11::string::~string((string *)&local_138);
  std::allocator<char>::~allocator((allocator<char> *)&local_139);
  std::__cxx11::string::~string((string *)&local_110);
  std::allocator<char>::~allocator((allocator<char> *)&local_111);
  std::__cxx11::string::~string((string *)&local_e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_e9);
  AddOption(this,(Option *)local_c8);
  Option::~Option((Option *)local_c8);
  return;
}

Assistant:

void OptionParser::AddOption(char short_name,
                             const char* long_name,
                             const char* metavar,
                             const char* help,
                             const Callback& callback) {
  Option option(short_name, long_name, metavar, HasArgument::Yes, help,
                callback);
  AddOption(option);
}